

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

bool __thiscall QDockWidgetGroupWindow::hasVisibleDockWidgets(QDockWidgetGroupWindow *this)

{
  bool bVar1;
  const_iterator o;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QDockWidget *child;
  QList<QDockWidget_*> *__range1;
  QList<QDockWidget_*> *children;
  const_iterator __end1;
  const_iterator __begin1;
  FindChildOption in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  WidgetAttribute in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  QFlagsStorage<Qt::FindChildOption> in_stack_ffffffffffffffbc;
  byte bVar2;
  const_iterator local_30 [5];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QFlags<Qt::FindChildOption>::QFlags
            ((QFlags<Qt::FindChildOption> *)
             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),in_stack_ffffffffffffff7c
            );
  QObject::findChildren<QDockWidget*>
            ((QObject *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
             (FindChildOptions)in_stack_ffffffffffffffbc.i);
  local_30[0].i = (QDockWidget **)&DAT_aaaaaaaaaaaaaaaa;
  local_30[0] = QList<QDockWidget_*>::begin
                          ((QList<QDockWidget_*> *)
                           CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  o = QList<QDockWidget_*>::end
                ((QList<QDockWidget_*> *)
                 CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  do {
    bVar1 = QList<QDockWidget_*>::const_iterator::operator!=(local_30,o);
    if (!bVar1) {
      bVar2 = 0;
LAB_005f1b53:
      QList<QDockWidget_*>::~QList((QList<QDockWidget_*> *)0x5f1b5d);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return (bool)(bVar2 & 1);
      }
      __stack_chk_fail();
    }
    QList<QDockWidget_*>::const_iterator::operator*(local_30);
    bVar1 = QWidget::testAttribute(in_RDI,in_stack_ffffffffffffff84);
    if (!bVar1) {
      bVar2 = 1;
      goto LAB_005f1b53;
    }
    QList<QDockWidget_*>::const_iterator::operator++(local_30);
  } while( true );
}

Assistant:

bool QDockWidgetGroupWindow::hasVisibleDockWidgets() const
{
    const auto &children = findChildren<QDockWidget *>(Qt::FindChildrenRecursively);
    for (auto child : children) {
        // WA_WState_Visible is set on the dock widget, associated to the active tab
        // and unset on all others.
        // WA_WState_Hidden is set if the dock widgets have been explicitly hidden.
        // This is the relevant information to check (equivalent to !child->isHidden()).
        if (!child->testAttribute(Qt::WA_WState_Hidden))
            return true;
    }
    return false;
}